

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall ProcessorGenerator::generate_class_definition(ProcessorGenerator *this)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  t_cpp_generator *ptVar5;
  char *pcVar6;
  pointer pptVar7;
  string ret_arg;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string parent_class;
  string local_1d0;
  string *local_1b0;
  string *local_1a8;
  string *local_1a0;
  string local_198;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_178;
  string *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  string local_150;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_178,
             &this->service_->functions_);
  local_130 = local_120;
  local_128 = 0;
  local_120[0] = 0;
  if (this->service_->extends_ == (t_service *)0x0) {
    std::operator==(&this->style_,"Cob");
    std::__cxx11::string::assign((char *)&local_130);
    if (this->generator_->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&local_130);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_130);
  }
  poVar4 = std::operator<<(this->f_header_,(string *)&this->template_header_);
  poVar4 = std::operator<<(poVar4,"class ");
  local_1b0 = (string *)&this->class_name_;
  poVar4 = std::operator<<(poVar4,local_1b0);
  poVar4 = std::operator<<(poVar4," : public ");
  poVar4 = std::operator<<(poVar4,(string *)&local_130);
  poVar4 = std::operator<<(poVar4," {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(this->f_header_," protected:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr<");
  local_160 = (string *)&this->if_name_;
  poVar4 = std::operator<<(poVar4,local_160);
  poVar4 = std::operator<<(poVar4,"> iface_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"virtual ");
  poVar4 = std::operator<<(poVar4,(string *)&this->ret_type_);
  poVar4 = std::operator<<(poVar4,"dispatchCall(");
  local_1a0 = (string *)&this->finish_cob_;
  poVar4 = std::operator<<(poVar4,local_1a0);
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* iprot, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, ");
  poVar4 = std::operator<<(poVar4,"const std::string& fname, int32_t seqid");
  local_1a8 = (string *)&this->call_context_;
  poVar4 = std::operator<<(poVar4,local_1a8);
  poVar4 = std::operator<<(poVar4,") override;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  ptVar5 = this->generator_;
  if (ptVar5->gen_templates_ == true) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_1d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"virtual ");
    poVar4 = std::operator<<(poVar4,(string *)&this->ret_type_);
    poVar4 = std::operator<<(poVar4,"dispatchCallTemplated(");
    poVar4 = std::operator<<(poVar4,local_1a0);
    poVar4 = std::operator<<(poVar4,"Protocol_* iprot, Protocol_* oprot, ");
    poVar4 = std::operator<<(poVar4,"const std::string& fname, int32_t seqid");
    poVar4 = std::operator<<(poVar4,local_1a8);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d0);
    ptVar5 = this->generator_;
  }
  piVar1 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = std::operator<<(this->f_header_," private:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"typedef  void (");
  poVar4 = std::operator<<(poVar4,local_1b0);
  poVar4 = std::operator<<(poVar4,"::*");
  poVar4 = std::operator<<(poVar4,"ProcessFunction)(");
  poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_decl_);
  poVar4 = std::operator<<(poVar4,"int32_t, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol*, ");
  poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol*");
  poVar4 = std::operator<<(poVar4,(string *)&this->call_context_decl_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar4 = this->f_header_;
  if (this->generator_->gen_templates_ == true) {
    indent_abi_cxx11_(&local_1d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"typedef void (");
    poVar4 = std::operator<<(poVar4,local_1b0);
    poVar4 = std::operator<<(poVar4,"::*");
    poVar4 = std::operator<<(poVar4,"SpecializedProcessFunction)(");
    poVar4 = std::operator<<(poVar4,(string *)&this->finish_cob_decl_);
    poVar4 = std::operator<<(poVar4,"int32_t, ");
    poVar4 = std::operator<<(poVar4,"Protocol_*, Protocol_*");
    poVar4 = std::operator<<(poVar4,(string *)&this->call_context_decl_);
    poVar4 = std::operator<<(poVar4,");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_198,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,"struct ProcessFunctions {");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_150,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_150);
    poVar4 = std::operator<<(poVar4,"  ProcessFunction generic;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_50,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,"  SpecializedProcessFunction specialized;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_70,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,"  ProcessFunctions(ProcessFunction g, ");
    poVar4 = std::operator<<(poVar4,"SpecializedProcessFunction s) :");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_90,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,"    generic(g),");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_b0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4,"    specialized(s) {}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,"  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
                            );
    poVar4 = std::operator<<(poVar4,"{}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_f0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_f0);
    poVar4 = std::operator<<(poVar4,"};");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_110,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,"typedef std::map<std::string, ProcessFunctions> ");
    poVar4 = std::operator<<(poVar4,"ProcessMap;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    indent_abi_cxx11_(&local_1d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"typedef std::map<std::string, ProcessFunction> ");
    poVar4 = std::operator<<(poVar4,"ProcessMap;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"ProcessMap processMap_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_158 = &this->style_;
  for (pptVar7 = local_178._M_impl.super__Vector_impl_data._M_start;
      pptVar7 != local_178._M_impl.super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    poVar4 = indent(this,this->f_header_);
    poVar4 = std::operator<<(poVar4,"void process_");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = std::operator<<(poVar4,local_1a0);
    poVar4 = std::operator<<(poVar4,
                             "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot"
                            );
    poVar4 = std::operator<<(poVar4,local_1a8);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    if (this->generator_->gen_templates_ == true) {
      poVar4 = indent(this,this->f_header_);
      poVar4 = std::operator<<(poVar4,"void process_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = std::operator<<(poVar4,local_1a0);
      poVar4 = std::operator<<(poVar4,"int32_t seqid, Protocol_* iprot, Protocol_* oprot");
      poVar4 = std::operator<<(poVar4,local_1a8);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    bVar2 = std::operator==(local_158,"Cob");
    if (bVar2) {
      iVar3 = (*((*pptVar7)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar3 == '\0') {
        type_name_abi_cxx11_(&local_150,this,(*pptVar7)->returntype_,false,false);
        std::operator+(&local_198,", const ",&local_150);
        std::operator+(&local_1d0,&local_198,"& _return");
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_150);
      }
      else {
        std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_198);
      }
      poVar4 = this->f_header_;
      indent_abi_cxx11_(&local_198,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_198);
      poVar4 = std::operator<<(poVar4,"void return_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
      poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, ");
      poVar4 = std::operator<<(poVar4,"void* ctx");
      poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_198);
      if (this->generator_->gen_templates_ == true) {
        poVar4 = this->f_header_;
        indent_abi_cxx11_(&local_198,this);
        poVar4 = std::operator<<(poVar4,(string *)&local_198);
        poVar4 = std::operator<<(poVar4,"void return_");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
        poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
        poVar4 = std::operator<<(poVar4,"Protocol_* oprot, void* ctx");
        poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
        poVar4 = std::operator<<(poVar4,");");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_198);
      }
      poVar4 = this->f_header_;
      indent_abi_cxx11_(&local_198,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_198);
      poVar4 = std::operator<<(poVar4,"void throw_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
      poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::protocol::TProtocol* oprot, void* ctx, ");
      poVar4 = std::operator<<(poVar4,"::apache::thrift::TDelayedException* _throw);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_198);
      if (this->generator_->gen_templates_ == true) {
        poVar4 = this->f_header_;
        indent_abi_cxx11_(&local_198,this);
        poVar4 = std::operator<<(poVar4,(string *)&local_198);
        poVar4 = std::operator<<(poVar4,"void throw_");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
        poVar4 = std::operator<<(poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ");
        poVar4 = std::operator<<(poVar4,"Protocol_* oprot, void* ctx, ");
        poVar4 = std::operator<<(poVar4,"::apache::thrift::TDelayedException* _throw);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_198);
      }
      std::__cxx11::string::~string((string *)&local_1d0);
    }
  }
  poVar4 = std::operator<<(this->f_header_," public:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,local_1b0);
  poVar4 = std::operator<<(poVar4,"(::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,local_160);
  poVar4 = std::operator<<(poVar4,"> iface) :");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  if ((this->extends_)._M_string_length != 0) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_1d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)&this->extends_);
    poVar4 = std::operator<<(poVar4,"(iface),");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"  iface_(iface) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar7 = local_178._M_impl.super__Vector_impl_data._M_start;
      pptVar7 != local_178._M_impl.super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    poVar4 = this->f_header_;
    indent_abi_cxx11_(&local_1d0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
    poVar4 = std::operator<<(poVar4,"processMap_[\"");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
    std::operator<<(poVar4,"\"] = ");
    std::__cxx11::string::~string((string *)&local_1d0);
    if (this->generator_->gen_templates_ == true) {
      poVar4 = std::operator<<(this->f_header_,"ProcessFunctions(");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      if (this->generator_->gen_templates_only_ == true) {
        poVar4 = indent(this,this->f_header_);
        pcVar6 = "  nullptr,";
      }
      else {
        poVar4 = indent(this,this->f_header_);
        poVar4 = std::operator<<(poVar4,"  &");
        poVar4 = std::operator<<(poVar4,local_1b0);
        poVar4 = std::operator<<(poVar4,"::process_");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
        pcVar6 = ",";
      }
      poVar4 = std::operator<<(poVar4,pcVar6);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = indent(this,this->f_header_);
      poVar4 = std::operator<<(poVar4,"  &");
      poVar4 = std::operator<<(poVar4,local_1b0);
      poVar4 = std::operator<<(poVar4,"::process_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
      std::operator<<(poVar4,")");
    }
    else {
      poVar4 = std::operator<<(this->f_header_,"&");
      poVar4 = std::operator<<(poVar4,local_1b0);
      poVar4 = std::operator<<(poVar4,"::process_");
      std::operator<<(poVar4,(string *)&(*pptVar7)->name_);
    }
    poVar4 = std::operator<<(this->f_header_,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = this->f_header_;
  indent_abi_cxx11_(&local_1d0,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_198,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_198);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,local_1b0);
  poVar4 = std::operator<<(poVar4,"() {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1d0);
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = std::operator<<(this->f_header_,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if (this->generator_->gen_templates_ == true) {
    poVar4 = std::operator<<(this->f_header_,"typedef ");
    poVar4 = std::operator<<(poVar4,local_1b0);
    poVar4 = std::operator<<(poVar4,"< ::apache::thrift::protocol::TDummyProtocol > ");
    poVar4 = std::operator<<(poVar4,(string *)&this->service_name_);
    poVar4 = std::operator<<(poVar4,(string *)&this->pstyle_);
    poVar4 = std::operator<<(poVar4,"Processor;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_178);
  return;
}

Assistant:

void ProcessorGenerator::generate_class_definition() {
  // Generate the dispatch methods
  vector<t_function*> functions = service_->get_functions();
  vector<t_function*>::iterator f_iter;

  string parent_class;
  if (service_->get_extends() != nullptr) {
    parent_class = extends_;
  } else {
    if (style_ == "Cob") {
      parent_class = "::apache::thrift::async::TAsyncDispatchProcessor";
    } else {
      parent_class = "::apache::thrift::TDispatchProcessor";
    }

    if (generator_->gen_templates_) {
      parent_class += "T<Protocol_>";
    }
  }

  // Generate the header portion
  f_header_ << template_header_ << "class " << class_name_ << " : public " << parent_class << " {"
            << endl;

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << "::std::shared_ptr<" << if_name_ << "> iface_;" << endl;
  f_header_ << indent() << "virtual " << ret_type_ << "dispatchCall(" << finish_cob_
            << "::apache::thrift::protocol::TProtocol* iprot, "
            << "::apache::thrift::protocol::TProtocol* oprot, "
            << "const std::string& fname, int32_t seqid" << call_context_ 
            << ") override;" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "virtual " << ret_type_ << "dispatchCallTemplated(" << finish_cob_
              << "Protocol_* iprot, Protocol_* oprot, "
              << "const std::string& fname, int32_t seqid" << call_context_ << ");" << endl;
  }
  indent_down();

  // Process function declarations
  f_header_ << " private:" << endl;
  indent_up();

  // Declare processMap_
  f_header_ << indent() << "typedef  void (" << class_name_ << "::*"
            << "ProcessFunction)(" << finish_cob_decl_ << "int32_t, "
            << "::apache::thrift::protocol::TProtocol*, "
            << "::apache::thrift::protocol::TProtocol*" << call_context_decl_ << ");" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "typedef void (" << class_name_ << "::*"
              << "SpecializedProcessFunction)(" << finish_cob_decl_ << "int32_t, "
              << "Protocol_*, Protocol_*" << call_context_decl_ << ");" << endl << indent()
              << "struct ProcessFunctions {" << endl << indent() << "  ProcessFunction generic;"
              << endl << indent() << "  SpecializedProcessFunction specialized;" << endl << indent()
              << "  ProcessFunctions(ProcessFunction g, "
              << "SpecializedProcessFunction s) :" << endl << indent() << "    generic(g)," << endl
              << indent() << "    specialized(s) {}" << endl << indent()
              << "  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
              << "{}" << endl << indent() << "};" << endl << indent()
              << "typedef std::map<std::string, ProcessFunctions> "
              << "ProcessMap;" << endl;
  } else {
    f_header_ << indent() << "typedef std::map<std::string, ProcessFunction> "
              << "ProcessMap;" << endl;
  }
  f_header_ << indent() << "ProcessMap processMap_;" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                      << "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, "
                         "::apache::thrift::protocol::TProtocol* oprot" << call_context_ << ");"
                      << endl;
    if (generator_->gen_templates_) {
      indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                        << "int32_t seqid, Protocol_* iprot, Protocol_* oprot" << call_context_
                        << ");" << endl;
    }
    if (style_ == "Cob") {
      // XXX Factor this out, even if it is a pain.
      string ret_arg = ((*f_iter)->get_returntype()->is_void()
                            ? ""
                            : ", const " + type_name((*f_iter)->get_returntype()) + "& _return");
      f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, "
                << "void* ctx" << ret_arg << ");" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx" << ret_arg << ");" << endl;
      }
      // XXX Don't declare throw if it doesn't exist
      f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, void* ctx, "
                << "::apache::thrift::TDelayedException* _throw);" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx, "
                  << "::apache::thrift::TDelayedException* _throw);" << endl;
      }
    }
  }

  f_header_ << " public:" << endl << indent() << class_name_ << "(::std::shared_ptr<" << if_name_
            << "> iface) :" << endl;
  if (!extends_.empty()) {
    f_header_ << indent() << "  " << extends_ << "(iface)," << endl;
  }
  f_header_ << indent() << "  iface_(iface) {" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << "processMap_[\"" << (*f_iter)->get_name() << "\"] = ";
    if (generator_->gen_templates_) {
      f_header_ << "ProcessFunctions(" << endl;
      if (generator_->gen_templates_only_) {
        indent(f_header_) << "  nullptr," << endl;
      } else {
        indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ","
                          << endl;
      }
      indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ")";
    } else {
      f_header_ << "&" << class_name_ << "::process_" << (*f_iter)->get_name();
    }
    f_header_ << ";" << endl;
  }

  indent_down();
  f_header_ << indent() << "}" << endl << endl << indent() << "virtual ~" << class_name_ << "() {}"
            << endl;
  indent_down();
  f_header_ << "};" << endl << endl;

  if (generator_->gen_templates_) {
    // Generate a backwards compatible typedef, for callers who don't know
    // about the new template-style code.
    //
    // We can't use TProtocol as the template parameter, since ProcessorT
    // provides overloaded versions of most methods, one of which accepts
    // TProtocol pointers, and one which accepts Protocol_ pointers.  This
    // results in a compile error if instantiated with Protocol_ == TProtocol.
    // Therefore, we define TDummyProtocol solely so we can use it as the
    // template parameter here.
    f_header_ << "typedef " << class_name_ << "< ::apache::thrift::protocol::TDummyProtocol > "
              << service_name_ << pstyle_ << "Processor;" << endl << endl;
  }
}